

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O3

int cuddWindowReorder(DdManager *table,int low,int high,Cudd_ReorderingType submethod)

{
  undefined4 *puVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  void *__ptr;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  
  iVar11 = 0;
  switch(submethod) {
  case CUDD_REORDER_WINDOW2:
    iVar11 = ddWindow2(table,low,high);
    return iVar11;
  case CUDD_REORDER_WINDOW3:
switchD_007a4b86_caseD_9:
    iVar11 = ddWindow3(table,low,high);
    return iVar11;
  case CUDD_REORDER_WINDOW4:
    if (high - low < 3) goto switchD_007a4b86_caseD_9;
    iVar11 = low + 2;
    while (iVar11 < high) {
      iVar11 = ddPermuteWindow4(table,low);
      if (iVar11 == 0) {
        return 0;
      }
      iVar11 = low + 3;
      low = low + 1;
    }
    break;
  case CUDD_REORDER_WINDOW2_CONV:
    iVar11 = ddWindowConv2(table,low,high);
    return iVar11;
  case CUDD_REORDER_WINDOW3_CONV:
switchD_007a4b86_caseD_c:
    iVar11 = ddWindowConv3(table,low,high);
    return iVar11;
  case CUDD_REORDER_WINDOW4_CONV:
    iVar11 = high - low;
    if (iVar11 < 3) goto switchD_007a4b86_caseD_c;
    uVar10 = (ulong)(iVar11 - 2);
    __ptr = malloc(uVar10 * 4);
    auVar3 = _DAT_007ee2e0;
    if (__ptr == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
    lVar5 = uVar10 - 1;
    auVar12._8_4_ = (int)lVar5;
    auVar12._0_8_ = lVar5;
    auVar12._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar7 = 0;
    auVar12 = auVar12 ^ _DAT_007ee2e0;
    auVar14 = _DAT_007ee2c0;
    auVar15 = _DAT_007ee2d0;
    do {
      auVar16 = auVar15 ^ auVar3;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar13 && auVar12._0_4_ < auVar16._0_4_ ||
                  iVar13 < auVar16._4_4_) & 1)) {
        *(undefined4 *)((long)__ptr + uVar7 * 4) = 1;
      }
      if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
          auVar16._12_4_ <= auVar12._12_4_) {
        *(undefined4 *)((long)__ptr + uVar7 * 4 + 4) = 1;
      }
      auVar16 = auVar14 ^ auVar3;
      iVar17 = auVar16._4_4_;
      if (iVar17 <= iVar13 && (iVar17 != iVar13 || auVar16._0_4_ <= auVar12._0_4_)) {
        *(undefined4 *)((long)__ptr + uVar7 * 4 + 8) = 1;
        *(undefined4 *)((long)__ptr + uVar7 * 4 + 0xc) = 1;
      }
      uVar7 = uVar7 + 4;
      lVar5 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar5 + 4;
      lVar5 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar5 + 4;
    } while ((iVar11 + 1U & 0xfffffffc) != uVar7);
    lVar8 = (long)(iVar11 + -3);
    lVar9 = (long)(iVar11 + -5);
    lVar5 = (long)(iVar11 + -4);
    uVar7 = 0;
    bVar4 = false;
    do {
      do {
        bVar2 = bVar4;
        if (*(int *)((long)__ptr + uVar7 * 4) != 0) {
          iVar11 = ddPermuteWindow4(table,low + (int)uVar7);
          if (0x17 < iVar11 - 1U) {
            free(__ptr);
            return 0;
          }
          puVar1 = (undefined4 *)((long)__ptr + uVar7 * 4);
          switch(iVar11) {
          case 1:
            break;
          case 2:
            if ((long)uVar7 < lVar5) {
              puVar1[2] = 1;
            }
            bVar2 = true;
            lVar6 = -8;
            if (1 < uVar7) {
LAB_007a4f1d:
              *(undefined4 *)((long)puVar1 + lVar6) = 1;
              goto LAB_007a4f24;
            }
            break;
          case 3:
          case 5:
          case 10:
            if ((long)uVar7 < lVar5) {
              puVar1[2] = 1;
            }
            if ((long)uVar7 < lVar8) {
              puVar1[1] = 1;
            }
            bVar2 = true;
            if (1 < uVar7) {
              puVar1[-2] = 1;
              lVar6 = -0xc;
              if (uVar7 != 2) goto LAB_007a4f1d;
            }
            break;
          case 4:
          case 9:
          case 0xe:
            if ((long)uVar7 < lVar9) {
              puVar1[3] = 1;
            }
            if ((long)uVar7 < lVar5) {
              puVar1[2] = 1;
            }
            bVar2 = true;
            if (uVar7 != 0) {
              puVar1[-1] = 1;
              lVar6 = -8;
              if (uVar7 != 1) goto LAB_007a4f1d;
            }
            break;
          default:
            if ((long)uVar7 < lVar9) {
              puVar1[3] = 1;
            }
            if ((long)uVar7 < lVar5) {
              puVar1[2] = 1;
            }
            if ((long)uVar7 < lVar8) {
              puVar1[1] = 1;
            }
            bVar2 = true;
            if ((uVar7 != 0) && (puVar1[-1] = 1, uVar7 != 1)) {
              puVar1[-2] = 1;
              goto LAB_007a4df4;
            }
            break;
          case 7:
            if ((long)uVar7 < lVar8) {
              puVar1[1] = 1;
            }
LAB_007a4df4:
            bVar2 = true;
            lVar6 = -0xc;
            if (2 < uVar7) goto LAB_007a4f1d;
            break;
          case 8:
            if ((long)uVar7 < lVar9) {
              puVar1[3] = 1;
            }
            lVar6 = -4;
            if (uVar7 != 0) goto LAB_007a4f1d;
LAB_007a4f24:
            bVar2 = true;
            break;
          case 0xd:
            if ((long)uVar7 < lVar9) {
              puVar1[3] = 1;
            }
            if ((long)uVar7 < lVar8) {
              puVar1[1] = 1;
            }
            bVar2 = true;
            if (uVar7 != 0) {
              puVar1[-1] = 1;
              goto LAB_007a4df4;
            }
          }
          *puVar1 = 0;
        }
        uVar7 = uVar7 + 1;
        bVar4 = bVar2;
      } while (uVar7 != uVar10);
      uVar7 = 0;
      bVar4 = false;
    } while (bVar2);
    free(__ptr);
    break;
  default:
    goto switchD_007a4b86_default;
  }
  iVar11 = 1;
switchD_007a4b86_default:
  return iVar11;
}

Assistant:

int
cuddWindowReorder(
  DdManager * table /* DD table */,
  int low /* lowest index to reorder */,
  int high /* highest index to reorder */,
  Cudd_ReorderingType submethod /* window reordering option */)
{

    int res;
#ifdef DD_DEBUG
    int supposedOpt;
#endif

    switch (submethod) {
    case CUDD_REORDER_WINDOW2:
        res = ddWindow2(table,low,high);
        break;
    case CUDD_REORDER_WINDOW3:
        res = ddWindow3(table,low,high);
        break;
    case CUDD_REORDER_WINDOW4:
        res = ddWindow4(table,low,high);
        break;
    case CUDD_REORDER_WINDOW2_CONV:
        res = ddWindowConv2(table,low,high);
        break;
    case CUDD_REORDER_WINDOW3_CONV:
        res = ddWindowConv3(table,low,high);
#ifdef DD_DEBUG
        supposedOpt = table->keys - table->isolated;
        res = ddWindow3(table,low,high);
        if (table->keys - table->isolated != (unsigned) supposedOpt) {
            (void) fprintf(table->err, "Convergence failed! (%d != %d)\n",
                           table->keys - table->isolated, supposedOpt);
        }
#endif
        break;
    case CUDD_REORDER_WINDOW4_CONV:
        res = ddWindowConv4(table,low,high);
#ifdef DD_DEBUG
        supposedOpt = table->keys - table->isolated;
        res = ddWindow4(table,low,high);
        if (table->keys - table->isolated != (unsigned) supposedOpt) {
            (void) fprintf(table->err,"Convergence failed! (%d != %d)\n",
                           table->keys - table->isolated, supposedOpt);
        }
#endif
        break;
    default: return(0);
    }

    return(res);

}